

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O3

int Cba_FonRangeSize(Cba_Ntk_t *p,int f)

{
  Vec_Int_t *pVVar1;
  int *piVar2;
  uint uVar3;
  int iVar4;
  char *__nptr;
  int iVar5;
  
  if (f < 0) {
    __nptr = Abc_NamStr(p->pDesign->pFuns,~f);
    iVar5 = atoi(__nptr);
    return iVar5;
  }
  if (f == 0) {
    __assert_fail("Cba_FonIsReal(f)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cba.h"
                  ,0x113,"int Cba_FonRange(Cba_Ntk_t *, int)");
  }
  if (0 < (p->vFonRange).nSize) {
    Vec_IntFillExtra(&p->vFonRange,f + 1,0);
    if ((p->vFonRange).nSize <= f) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    uVar3 = (p->vFonRange).pArray[(uint)f];
    if ((int)uVar3 < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
    if (1 < uVar3) {
      pVVar1 = p->pDesign->vHash->vObjs;
      uVar3 = uVar3 * 2 & 0x7ffffffc;
      if (pVVar1->nSize <= (int)uVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      piVar2 = pVVar1->pArray;
      iVar5 = piVar2[uVar3] - piVar2[(ulong)uVar3 + 1];
      goto LAB_0087e7b0;
    }
  }
  iVar5 = 0;
LAB_0087e7b0:
  iVar4 = -iVar5;
  if (0 < iVar5) {
    iVar4 = iVar5;
  }
  return iVar4 + 1;
}

Assistant:

static inline int            Cba_FonRangeSize( Cba_Ntk_t * p, int f )        { return Cba_FonIsConst(f) ? Cba_FonConstRangeSize(p, f):Cba_NtkRangeSize(p, Cba_FonRange(p, f)); }